

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O2

void VOX_AddVoxel(int sprnum,int frame,FVoxelDef *def)

{
  uint amount;
  byte bVar1;
  spritedef_t *psVar2;
  spriteframe_t *psVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  spriteframe_t *psVar7;
  spriteframe_t *psVar8;
  ulong uVar9;
  spriteframe_t *psVar10;
  byte bVar11;
  
  psVar2 = sprites.Array;
  bVar11 = 0;
  bVar1 = sprites.Array[sprnum].numframes;
  if ((int)(uint)bVar1 <= frame) {
    amount = frame + 1;
    if ((bVar1 == 0) ||
       ((uint)sprites.Array[sprnum].spriteframes + (uint)bVar1 == SpriteFrames.Count)) {
      uVar4 = TArray<spriteframe_t,_spriteframe_t>::Reserve(&SpriteFrames,amount - bVar1);
      uVar5 = (uint)psVar2[sprnum].numframes;
      if (psVar2[sprnum].numframes == 0) {
        psVar2[sprnum].spriteframes = (WORD)uVar4;
        uVar5 = 0;
      }
    }
    else {
      uVar4 = TArray<spriteframe_t,_spriteframe_t>::Reserve(&SpriteFrames,amount);
      psVar3 = SpriteFrames.Array;
      psVar10 = SpriteFrames.Array;
      for (uVar9 = 0; uVar5 = (uint)psVar2[sprnum].numframes, uVar9 < psVar2[sprnum].numframes;
          uVar9 = uVar9 + 1) {
        psVar7 = psVar10 + psVar2[sprnum].spriteframes;
        psVar8 = psVar3 + (uVar4 + (int)uVar9);
        for (lVar6 = 0x4a; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined1 *)&psVar8->Voxel = *(undefined1 *)&psVar7->Voxel;
          psVar7 = (spriteframe_t *)((long)psVar7 + (ulong)bVar11 * -2 + 1);
          psVar8 = (spriteframe_t *)((long)psVar8 + (ulong)bVar11 * -2 + 1);
        }
        psVar10 = psVar10 + 1;
      }
      psVar2[sprnum].spriteframes = (WORD)uVar4;
      uVar4 = uVar4 + (int)uVar9;
    }
    memset(SpriteFrames.Array + uVar4,0,(long)(int)(amount - uVar5) * 0x50);
    psVar2[sprnum].numframes = (BYTE)amount;
  }
  SpriteFrames.Array[(long)frame + (ulong)sprites.Array[sprnum].spriteframes].Voxel = def;
  return;
}

Assistant:

void VOX_AddVoxel(int sprnum, int frame, FVoxelDef *def)
{
	R_ExtendSpriteFrames(sprites[sprnum], frame);
	SpriteFrames[sprites[sprnum].spriteframes + frame].Voxel = def;
}